

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O0

void __thiscall
QScrollerPrivate::handleDrag(QScrollerPrivate *this,QPointF *position,qint64 timestamp)

{
  bool bVar1;
  double dVar2;
  qreal qVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QScrollerPropertiesPrivate *pQVar7;
  char *in_RDX;
  undefined4 *in_RSI;
  QMessageLogger *in_RDI;
  long in_FS_OFFSET;
  byte bVar8;
  QPointF QVar9;
  bool canScrollY;
  bool canScrollX;
  qreal alpha;
  bool vertical;
  int dy;
  int dx;
  qint64 deltaTime;
  QScrollerPropertiesPrivate *sp;
  QRectF max;
  QPointF deltaPixel;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  undefined2 in_stack_ffffffffffffff18;
  undefined1 in_stack_ffffffffffffff1a;
  byte bVar10;
  undefined1 in_stack_ffffffffffffff1b;
  undefined4 uVar11;
  undefined1 t;
  QPointF *in_stack_ffffffffffffff20;
  QLoggingCategoryMacroHolder<(QtMsgType)0> *this_00;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar13;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 in_stack_ffffffffffffff3f;
  char *local_80;
  char *local_78;
  char *local_70;
  qreal in_stack_ffffffffffffff98;
  QPointF *in_stack_ffffffffffffffa0;
  QScrollerPrivate *in_stack_ffffffffffffffa8;
  QDebug local_40;
  qreal local_38;
  qreal local_30;
  QPointF local_28;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  undefined3 uVar12;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar7 = QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
           ::data((QScopedPointer<QScrollerPropertiesPrivate,_QScopedPointerDeleter<QScrollerPropertiesPrivate>_>
                   *)(in_RDI + 1));
  local_28.xp = -NAN;
  local_28.yp = -NAN;
  QVar9 = ::operator-((QPointF *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                      in_stack_ffffffffffffff20);
  local_28.yp = QVar9.yp;
  local_28.xp = QVar9.xp;
  if ((pQVar7->axisLockThreshold != 0.0) || (NAN(pQVar7->axisLockThreshold))) {
    local_30 = QPointF::x(&local_28);
    dVar2 = qAbs<double>(&local_30);
    iVar5 = (int)dVar2;
    local_38 = QPointF::y(&local_28);
    dVar2 = qAbs<double>(&local_38);
    iVar6 = (int)dVar2;
    if ((iVar5 != 0) || (iVar6 != 0)) {
      bVar1 = iVar6 <= iVar5;
      iVar13 = iVar6;
      if (!bVar1) {
        iVar13 = iVar5;
      }
      this_00 = (QLoggingCategoryMacroHolder<(QtMsgType)0> *)(double)iVar13;
      if (bVar1) {
        uVar12 = (undefined3)iVar5;
        t = (undefined1)((uint)iVar5 >> 0x18);
      }
      else {
        uVar12 = (undefined3)iVar6;
        t = (undefined1)((uint)iVar6 >> 0x18);
      }
      uVar11 = CONCAT31(uVar12,in_stack_ffffffffffffff1b);
      dVar2 = (double)this_00 / (double)CONCAT13(t,uVar12);
      local_18 = &DAT_aaaaaaaaaaaaaaaa;
      local_10 = &DAT_aaaaaaaaaaaaaaaa;
      lcScroller();
      anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                (this_00,(QLoggingCategory *)
                         CONCAT17(t,CONCAT43(uVar11,CONCAT12(in_stack_ffffffffffffff1a,
                                                             in_stack_ffffffffffffff18))));
      while (bVar4 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_18), bVar4) {
        anon_unknown.dwarf_1b15c9b::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0xa89234);
        QMessageLogger::QMessageLogger
                  (in_RDI,(char *)CONCAT44(iVar13,in_stack_ffffffffffffff28),
                   (int)((ulong)this_00 >> 0x20),
                   (char *)CONCAT17(t,CONCAT43(uVar11,CONCAT12(in_stack_ffffffffffffff1a,
                                                               in_stack_ffffffffffffff18))),
                   (char *)0xa8924d);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)
                           CONCAT17(in_stack_ffffffffffffff3f,
                                    CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                           in_RDX);
        QDebug::operator<<((QDebug *)this_00,
                           (double)CONCAT17(t,CONCAT43(uVar11,CONCAT12(in_stack_ffffffffffffff1a,
                                                                       in_stack_ffffffffffffff18))))
        ;
        QDebug::operator<<((QDebug *)
                           CONCAT17(in_stack_ffffffffffffff3f,
                                    CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                           in_RDX);
        QDebug::operator<<((QDebug *)this_00,
                           (double)CONCAT17(t,CONCAT43(uVar11,CONCAT12(in_stack_ffffffffffffff1a,
                                                                       in_stack_ffffffffffffff18))))
        ;
        QDebug::operator<<((QDebug *)
                           CONCAT17(in_stack_ffffffffffffff3f,
                                    CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                           in_RDX);
        QDebug::operator<<((QDebug *)this_00,(bool)t);
        QDebug::operator<<((QDebug *)
                           CONCAT17(in_stack_ffffffffffffff3f,
                                    CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                           in_RDX);
        QDebug::operator<<((QDebug *)this_00,CONCAT13(t,(int3)((uint)uVar11 >> 8)));
        QDebug::operator<<((QDebug *)
                           CONCAT17(in_stack_ffffffffffffff3f,
                                    CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
                           in_RDX);
        QDebug::operator<<((QDebug *)this_00,CONCAT13(t,(int3)((uint)uVar11 >> 8)));
        QDebug::~QDebug(&local_40);
        local_10 = (undefined1 *)((ulong)local_10 & 0xffffffffffffff00);
      }
      if (dVar2 <= pQVar7->axisLockThreshold) {
        if (bVar1) {
          QPointF::setY(&local_28,0.0);
        }
        else {
          QPointF::setX(&local_28,0.0);
        }
      }
    }
  }
  updateVelocity(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                 (qint64)in_stack_ffffffffffffff98);
  local_80 = in_RDI[2].context.file;
  local_78 = in_RDI[2].context.function;
  local_70 = in_RDI[2].context.category;
  qVar3 = QRectF::width((QRectF *)&local_80);
  bVar8 = true;
  if (qVar3 <= 0.0) {
    bVar8 = pQVar7->hOvershootPolicy == OvershootAlwaysOn;
  }
  qVar3 = QRectF::height((QRectF *)&local_80);
  bVar10 = true;
  if (qVar3 <= 0.0) {
    bVar10 = pQVar7->vOvershootPolicy == OvershootAlwaysOn;
  }
  if ((bVar8 & 1) == 0) {
    QPointF::setX(&local_28,0.0);
    QPointF::setX((QPointF *)&in_RDI[0xc].context.file,0.0);
  }
  if ((bVar10 & 1) == 0) {
    QPointF::setY(&local_28,0.0);
    QPointF::setY((QPointF *)&in_RDI[0xc].context.file,0.0);
  }
  QPointF::operator+=((QPointF *)&in_RDI[6].context.category,&local_28);
  uVar11 = in_RSI[1];
  iVar5 = in_RSI[2];
  iVar6 = in_RSI[3];
  *(undefined4 *)&in_RDI[5].context.category = *in_RSI;
  *(undefined4 *)((long)&in_RDI[5].context.category + 4) = uVar11;
  in_RDI[6].context.version = iVar5;
  in_RDI[6].context.line = iVar6;
  in_RDI[6].context.function = in_RDX;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QScrollerPrivate::handleDrag(const QPointF &position, qint64 timestamp)
{
    const QScrollerPropertiesPrivate *sp = properties.d.data();

    QPointF deltaPixel = position - lastPosition;
    qint64 deltaTime = timestamp - lastTimestamp;

    if (sp->axisLockThreshold) {
        int dx = qAbs(deltaPixel.x());
        int dy = qAbs(deltaPixel.y());
        if (dx || dy) {
            bool vertical = (dy > dx);
            qreal alpha = qreal(vertical ? dx : dy) / qreal(vertical ? dy : dx);
            qCDebug(lcScroller) << "QScroller::handleDrag() -- axis lock:" << alpha << " / " << sp->axisLockThreshold
                                << "- isvertical:" << vertical << "- dx:" << dx << "- dy:" << dy;
            if (alpha <= sp->axisLockThreshold) {
                if (vertical)
                    deltaPixel.setX(0);
                else
                    deltaPixel.setY(0);
            }
        }
    }

    // calculate velocity (if the user would release the mouse NOW)
    updateVelocity(deltaPixel, deltaTime);

    // restrict velocity, if content is not scrollable
    QRectF max = contentPosRange;
    bool canScrollX = (max.width() > 0) || (sp->hOvershootPolicy == QScrollerProperties::OvershootAlwaysOn);
    bool canScrollY = (max.height() > 0) || (sp->vOvershootPolicy == QScrollerProperties::OvershootAlwaysOn);

    if (!canScrollX) {
        deltaPixel.setX(0);
        releaseVelocity.setX(0);
    }
    if (!canScrollY) {
        deltaPixel.setY(0);
        releaseVelocity.setY(0);
    }

    dragDistance += deltaPixel;
    lastPosition = position;
    lastTimestamp = timestamp;
}